

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersection.cpp
# Opt level: O0

IntersectionData *
vera::intersection(IntersectionData *__return_storage_ptr__,Line *_line,Plane *_plane)

{
  vec3 *pvVar1;
  vec3 *v;
  double dVar2;
  vec3 vVar3;
  vec<3,_float,_(glm::qualifier)0> vVar4;
  undefined8 local_e0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_d8;
  vec<3,_float,_(glm::qualifier)0> local_d0;
  vec<3,_float,_(glm::qualifier)0> local_c0 [2];
  vec<3,_float,_(glm::qualifier)0> local_a8;
  vec3 local_98;
  vec<3,_float,_(glm::qualifier)0> local_88;
  vec<3,_float,_(glm::qualifier)0> local_7c;
  vec3 local_70;
  vec<3,_float,_(glm::qualifier)0> local_60;
  vec3 local_50;
  vec<3,_float,_(glm::qualifier)0> local_3c;
  float local_30;
  float local_2c;
  float denom;
  float u;
  int pos2;
  int pos1;
  float dist2;
  float dist1;
  Plane *_plane_local;
  Line *_line_local;
  
  _dist2 = _plane;
  _plane_local = (Plane *)_line;
  IntersectionData::IntersectionData(__return_storage_ptr__);
  pvVar1 = Line::operator[]((Line *)_plane_local,0);
  pos1 = (int)distance(pvVar1,_dist2);
  pvVar1 = Line::operator[]((Line *)_plane_local,1);
  pos2 = (int)distance(pvVar1,_dist2);
  u = (float)sign<float>((float *)&pos1);
  denom = (float)sign<float>((float *)&pos2);
  if (u == denom) {
    __return_storage_ptr__->hit = false;
  }
  else {
    local_2c = 0.0;
    vVar3 = Plane::getNormal(_dist2);
    local_50._0_8_ = vVar3._0_8_;
    local_3c.field_0 = local_50.field_0;
    local_3c.field_1 = local_50.field_1;
    local_50.field_2 = vVar3.field_2;
    local_3c.field_2 = local_50.field_2;
    local_50 = vVar3;
    pvVar1 = Line::getDireciton((Line *)_plane_local);
    local_30 = glm::dot<3,float,(glm::qualifier)0>(&local_3c,pvVar1);
    dVar2 = std::fabs((double)(ulong)(uint)local_30);
    if (SUB84(dVar2,0) <= 1e-10) {
      __return_storage_ptr__->hit = false;
    }
    else {
      vVar3 = Plane::getNormal(_dist2);
      local_70.field_2 = vVar3.field_2;
      local_60.field_2 = local_70.field_2;
      local_70._0_8_ = vVar3._0_8_;
      local_60.field_0 = local_70.field_0;
      local_60.field_1 = local_70.field_1;
      local_70 = vVar3;
      vVar3 = Plane::getOrigin(_dist2);
      local_98.field_2 = vVar3.field_2;
      local_88.field_2 = local_98.field_2;
      local_98._0_8_ = vVar3._0_8_;
      local_88.field_0 = local_98.field_0;
      local_88.field_1 = local_98.field_1;
      local_98 = vVar3;
      pvVar1 = Line::operator[]((Line *)_plane_local,0);
      vVar4 = glm::operator-(&local_88,pvVar1);
      local_a8._0_8_ = vVar4._0_8_;
      local_7c.field_0 = local_a8.field_0;
      local_7c.field_1 = local_a8.field_1;
      local_a8.field_2 = vVar4.field_2;
      local_7c.field_2 = local_a8.field_2;
      local_a8 = vVar4;
      local_2c = glm::dot<3,float,(glm::qualifier)0>(&local_60,&local_7c);
      local_2c = local_2c / local_30;
      if ((1.0 < local_2c) || (local_2c < 0.0)) {
        __return_storage_ptr__->hit = false;
      }
      else {
        __return_storage_ptr__->hit = true;
        pvVar1 = Line::operator[]((Line *)_plane_local,0);
        v = Line::getDireciton((Line *)_plane_local);
        vVar4 = glm::operator*(v,local_2c);
        local_d0.field_2 = vVar4.field_2;
        local_c0[0].field_2 = local_d0.field_2;
        local_d0._0_8_ = vVar4._0_8_;
        local_c0[0].field_0 = local_d0.field_0;
        local_c0[0].field_1 = local_d0.field_1;
        vVar4 = glm::operator+(pvVar1,local_c0);
        local_e0 = vVar4._0_8_;
        local_d8 = vVar4.field_2;
        (__return_storage_ptr__->position).field_0 =
             (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_e0;
        (__return_storage_ptr__->position).field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_e0._4_4_;
        (__return_storage_ptr__->position).field_2 = local_d8;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IntersectionData intersection(const Line& _line, const Plane& _plane) {
    IntersectionData idata;
    
    float dist1 = distance(_line[0], _plane);
    float dist2 = distance(_line[1], _plane);
    int pos1 = sign(dist1);
    int pos2 = sign(dist2);
    
    if (pos1==pos2) {
        idata.hit = false;
        return idata;
    }
    
    float u = 0.0;
    float denom = glm::dot(_plane.getNormal(),_line.getDireciton());
    
    // check if ray is paralles to plane:
    
    if (fabs(denom) > EPS) {
        u= glm::dot(_plane.getNormal(),_plane.getOrigin()-_line[0])/denom;
        // check if intersection is within line-segment:
        if (u>1.0 || u<0) {
            idata.hit = false;
            return idata;
        }
        idata.hit=true;
        idata.position = _line[0]+_line.getDireciton()*u;
    }
    else
        idata.hit = false;
    

    return idata;
}